

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O0

void bitrv2conj(int n,int *ip,double *a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double yi;
  double yr;
  double xi;
  double xr;
  int local_38;
  int m2;
  int m;
  int l;
  int k1;
  int k;
  int j1;
  int j;
  double *a_local;
  int *ip_local;
  int n_local;
  
  *ip = 0;
  m2 = n;
  for (local_38 = 1; local_38 * 8 < m2; local_38 = local_38 << 1) {
    m2 = m2 >> 1;
    for (k = 0; k < local_38; k = k + 1) {
      ip[local_38 + k] = ip[k] + m2;
    }
  }
  iVar4 = local_38 * 2;
  if (local_38 << 3 == m2) {
    for (l = 0; l < local_38; l = l + 1) {
      for (k = 0; k < l; k = k + 1) {
        iVar5 = k * 2 + ip[l];
        iVar6 = l * 2 + ip[k];
        dVar1 = a[iVar5];
        dVar2 = a[iVar5 + 1];
        dVar3 = a[iVar6 + 1];
        a[iVar5] = a[iVar6];
        a[iVar5 + 1] = -dVar3;
        a[iVar6] = dVar1;
        a[iVar6 + 1] = -dVar2;
        iVar5 = iVar4 + iVar5;
        iVar6 = local_38 * 4 + iVar6;
        dVar1 = a[iVar5];
        dVar2 = a[iVar5 + 1];
        dVar3 = a[iVar6 + 1];
        a[iVar5] = a[iVar6];
        a[iVar5 + 1] = -dVar3;
        a[iVar6] = dVar1;
        a[iVar6 + 1] = -dVar2;
        iVar5 = iVar4 + iVar5;
        iVar6 = iVar6 + local_38 * -2;
        dVar1 = a[iVar5];
        dVar2 = a[iVar5 + 1];
        dVar3 = a[iVar6 + 1];
        a[iVar5] = a[iVar6];
        a[iVar5 + 1] = -dVar3;
        a[iVar6] = dVar1;
        a[iVar6 + 1] = -dVar2;
        iVar5 = iVar4 + iVar5;
        iVar6 = local_38 * 4 + iVar6;
        dVar1 = a[iVar5];
        dVar2 = a[iVar5 + 1];
        dVar3 = a[iVar6 + 1];
        a[iVar5] = a[iVar6];
        a[iVar5 + 1] = -dVar3;
        a[iVar6] = dVar1;
        a[iVar6 + 1] = -dVar2;
      }
      iVar5 = l * 2 + ip[l];
      a[iVar5 + 1] = -a[iVar5 + 1];
      iVar5 = iVar5 + iVar4;
      iVar6 = iVar5 + iVar4;
      dVar1 = a[iVar5];
      dVar2 = a[iVar5 + 1];
      dVar3 = a[iVar6 + 1];
      a[iVar5] = a[iVar6];
      a[iVar5 + 1] = -dVar3;
      a[iVar6] = dVar1;
      a[iVar6 + 1] = -dVar2;
      a[iVar4 + iVar6 + 1] = -a[iVar4 + iVar6 + 1];
    }
  }
  else {
    a[1] = -a[1];
    a[iVar4 + 1] = -a[iVar4 + 1];
    for (l = 1; l < local_38; l = l + 1) {
      for (k = 0; k < l; k = k + 1) {
        iVar5 = k * 2 + ip[l];
        iVar6 = l * 2 + ip[k];
        dVar1 = a[iVar5];
        dVar2 = a[iVar5 + 1];
        dVar3 = a[iVar6 + 1];
        a[iVar5] = a[iVar6];
        a[iVar5 + 1] = -dVar3;
        a[iVar6] = dVar1;
        a[iVar6 + 1] = -dVar2;
        iVar5 = iVar4 + iVar5;
        iVar6 = iVar4 + iVar6;
        dVar1 = a[iVar5];
        dVar2 = a[iVar5 + 1];
        dVar3 = a[iVar6 + 1];
        a[iVar5] = a[iVar6];
        a[iVar5 + 1] = -dVar3;
        a[iVar6] = dVar1;
        a[iVar6 + 1] = -dVar2;
      }
      iVar5 = l * 2 + ip[l];
      a[iVar5 + 1] = -a[iVar5 + 1];
      a[iVar5 + iVar4 + 1] = -a[iVar5 + iVar4 + 1];
    }
  }
  return;
}

Assistant:

void bitrv2conj(int n, int *ip, double *a)
{
    int j, j1, k, k1, l, m, m2;
    double xr, xi, yr, yi;
    
    ip[0] = 0;
    l = n;
    m = 1;
    while ((m << 3) < l) {
        l >>= 1;
        for (j = 0; j < m; j++) {
            ip[m + j] = ip[j] + l;
        }
        m <<= 1;
    }
    m2 = 2 * m;
    if ((m << 3) == l) {
        for (k = 0; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = -a[j1 + 1];
                yr = a[k1];
                yi = -a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = -a[j1 + 1];
                yr = a[k1];
                yi = -a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 -= m2;
                xr = a[j1];
                xi = -a[j1 + 1];
                yr = a[k1];
                yi = -a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = -a[j1 + 1];
                yr = a[k1];
                yi = -a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
            k1 = 2 * k + ip[k];
            a[k1 + 1] = -a[k1 + 1];
            j1 = k1 + m2;
            k1 = j1 + m2;
            xr = a[j1];
            xi = -a[j1 + 1];
            yr = a[k1];
            yi = -a[k1 + 1];
            a[j1] = yr;
            a[j1 + 1] = yi;
            a[k1] = xr;
            a[k1 + 1] = xi;
            k1 += m2;
            a[k1 + 1] = -a[k1 + 1];
        }
    } else {
        a[1] = -a[1];
        a[m2 + 1] = -a[m2 + 1];
        for (k = 1; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = -a[j1 + 1];
                yr = a[k1];
                yi = -a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += m2;
                xr = a[j1];
                xi = -a[j1 + 1];
                yr = a[k1];
                yi = -a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
            k1 = 2 * k + ip[k];
            a[k1 + 1] = -a[k1 + 1];
            a[k1 + m2 + 1] = -a[k1 + m2 + 1];
        }
    }
}